

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server_async.cpp
# Opt level: O1

void __thiscall Session::DoWrite(Session *this,size_t length)

{
  transfer_all_t local_61;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  socket *local_50;
  _Bind<void_(Session::*(std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_unsigned_long)>
  local_48;
  mutable_buffer local_28;
  
  local_28.size_ = 0x400;
  if (length < 0x400) {
    local_28.size_ = length;
  }
  local_28.data_ = &this->buffer_;
  std::__shared_ptr<Session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Session,void>
            ((__shared_ptr<Session,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__weak_ptr<Session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_48._M_f = (offset_in_Session_to_subr)OnWrite;
  local_48._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
  super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
  super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_58;
  local_60 = (element_type *)0x0;
  p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50 = &this->socket_;
  boost::asio::detail::
  initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::operator()((initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                *)&local_50,&local_48,&local_28,&local_61);
  if (local_48._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
      super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
      super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<Session>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<0UL,_std::shared_ptr<Session>,_false>._M_head_impl.
               super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
  }
  return;
}

Assistant:

void DoWrite(std::size_t length) {
#if USE_BIND
    boost::asio::async_write(socket_,
                             boost::asio::buffer(buffer_, length),
                             std::bind(&Session::OnWrite, shared_from_this(),
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#else
    auto self(shared_from_this());

    boost::asio::async_write(
        socket_,
        boost::asio::buffer(buffer_, length),
        [this, self](boost::system::error_code ec, std::size_t /*length*/) {
          if (!ec) {
            AsyncRead();
          }
        });
#endif  // USE_BIND
  }